

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  bool bVar1;
  string *__lhs;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue plat_abi;
  cmMakefile *this_local;
  
  plat_abi.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INTERNAL_PLATFORM_ABI",&local_41);
  local_20 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    __lhs = cmValue::operator*[abi_cxx11_(&local_20);
    bVar1 = std::operator==(__lhs,"ELF X32");
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32") {
      return true;
    }
  }
  return false;
}